

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorExpression.cxx
# Opt level: O3

string * cmGeneratorExpression::Evaluate
                   (string *__return_storage_ptr__,string *input,cmLocalGenerator *lg,string *config
                   ,cmGeneratorTarget *headTarget,cmGeneratorExpressionDAGChecker *dagChecker,
                   cmGeneratorTarget *currentTarget,string *language)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  undefined8 uVar3;
  size_type sVar4;
  string *psVar5;
  cmCompiledGeneratorExpression cge;
  cmConstStack<cmListFileContext,_cmListFileBacktrace> local_1d8;
  cmGeneratorExpressionDAGChecker *local_1c0;
  string local_1b8;
  cmCompiledGeneratorExpression local_198;
  
  sVar4 = Find(input);
  if (sVar4 == 0xffffffffffffffff) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = (input->_M_dataplus)._M_p;
    paVar1 = &input->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar2 == paVar1) {
      uVar3 = *(undefined8 *)((long)&input->field_2 + 8);
      (__return_storage_ptr__->field_2)._M_allocated_capacity = paVar1->_M_allocated_capacity;
      *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uVar3;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = pcVar2;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = paVar1->_M_allocated_capacity;
    }
    __return_storage_ptr__->_M_string_length = input->_M_string_length;
    (input->_M_dataplus)._M_p = (pointer)paVar1;
    input->_M_string_length = 0;
    (input->field_2)._M_local_buf[0] = '\0';
  }
  else {
    local_1d8.TopEntry.
    super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = (element_type *)0x0;
    local_1d8.TopEntry.
    super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_1c0 = dagChecker;
    cmConstStack<cmListFileContext,_cmListFileBacktrace>::cmConstStack(&local_1d8);
    local_1b8._M_dataplus._M_p = (input->_M_dataplus)._M_p;
    paVar1 = &input->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b8._M_dataplus._M_p == paVar1) {
      local_1b8.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
      local_1b8.field_2._8_8_ = *(undefined8 *)((long)&input->field_2 + 8);
      local_1b8._M_dataplus._M_p = (pointer)&local_1b8.field_2;
    }
    else {
      local_1b8.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
    }
    local_1b8._M_string_length = input->_M_string_length;
    (input->_M_dataplus)._M_p = (pointer)paVar1;
    input->_M_string_length = 0;
    (input->field_2)._M_local_buf[0] = '\0';
    cmCompiledGeneratorExpression::cmCompiledGeneratorExpression
              (&local_198,(cmListFileBacktrace *)&local_1d8,&local_1b8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
      operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
    }
    if (local_1d8.TopEntry.
        super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_1d8.TopEntry.
                 super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
    psVar5 = cmCompiledGeneratorExpression::Evaluate
                       (&local_198,lg,config,headTarget,local_1c0,currentTarget,language);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = (psVar5->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,pcVar2,pcVar2 + psVar5->_M_string_length);
    cmCompiledGeneratorExpression::~cmCompiledGeneratorExpression(&local_198);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmGeneratorExpression::Evaluate(
  std::string input, cmLocalGenerator* lg, const std::string& config,
  cmGeneratorTarget const* headTarget,
  cmGeneratorExpressionDAGChecker* dagChecker,
  cmGeneratorTarget const* currentTarget, std::string const& language)
{
  if (Find(input) != std::string::npos) {
    cmCompiledGeneratorExpression cge(cmListFileBacktrace(), std::move(input));
    return cge.Evaluate(lg, config, headTarget, dagChecker, currentTarget,
                        language);
  }
  return input;
}